

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

bool __thiscall r_exec::CSTOverlay::reduce(CSTOverlay *this,View *input,CSTOverlay **offspring)

{
  Atom *pAVar1;
  bool bVar2;
  uint uVar3;
  Code *pCVar4;
  reference p_00;
  _Fact *p_Var5;
  _Fact *p_Var6;
  Pred *this_00;
  HLPBindingMap *pHVar7;
  HLPBindingMap *source;
  size_type sVar8;
  P *pPVar9;
  uint64_t uVar10;
  Atom *this_01;
  CSTOverlay *pCVar11;
  iterator iVar12;
  P<r_exec::HLPBindingMap> local_b8;
  P<r_exec::HLPBindingMap> original_bindings;
  iterator local_a0;
  undefined1 local_90 [8];
  const_iterator p;
  _Fact *bound_pattern;
  P<r_exec::HLPBindingMap> bm;
  bool simulation;
  Pred *prediction;
  _Fact *input_object;
  P<r_exec::_Fact> local_48;
  P<r_exec::_Fact> currentInput;
  iterator __end1;
  iterator __begin1;
  vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *__range1;
  CSTOverlay **offspring_local;
  View *input_local;
  CSTOverlay *this_local;
  
  pCVar4 = core::P<r_code::Code>::operator->(&(input->super_View).object);
  uVar3 = (*(pCVar4->super__Object)._vptr__Object[0xe])();
  if ((uVar3 & 1) == 0) {
    __end1 = std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::begin
                       (&this->inputs);
    currentInput.object =
         (_Object *)
         std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::end
                   (&this->inputs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
                                       *)&currentInput), bVar2) {
      p_00 = __gnu_cxx::
             __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
             ::operator*(&__end1);
      core::P<r_exec::_Fact>::P(&local_48,p_00);
      p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
      p_Var5 = core::P::operator_cast_to__Fact_((P *)&local_48);
      if (p_Var6 == p_Var5) {
        *offspring = (CSTOverlay *)0x0;
        this_local._7_1_ = 0;
      }
      core::P<r_exec::_Fact>::~P(&local_48);
      if (p_Var6 == p_Var5) goto LAB_0021d4af;
      __gnu_cxx::
      __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
      ::operator++(&__end1);
    }
    p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
    this_00 = _Fact::get_pred(p_Var6);
    if (this_00 == (Pred *)0x0) {
      prediction = (Pred *)core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
      bm.object._7_1_ = false;
    }
    else {
      prediction = (Pred *)Pred::get_target(this_00);
      bm.object._7_1_ = Pred::is_simulation(this_00);
    }
    pHVar7 = (HLPBindingMap *)operator_new(0x40);
    HLPBindingMap::HLPBindingMap(pHVar7);
    core::P<r_exec::HLPBindingMap>::P((P<r_exec::HLPBindingMap> *)&bound_pattern,pHVar7);
    p._list = (list<core::P<r_exec::_Fact>_> *)0x0;
    r_code::list<core::P<r_exec::_Fact>_>::const_iterator::const_iterator
              ((const_iterator *)local_90);
    local_a0 = r_code::list<core::P<r_exec::_Fact>_>::begin(&(this->super_HLPOverlay).patterns);
    r_code::list<core::P<r_exec::_Fact>_>::const_iterator::operator=
              ((const_iterator *)local_90,&local_a0);
    while( true ) {
      iVar12 = r_code::list<core::P<r_exec::_Fact>_>::end(&(this->super_HLPOverlay).patterns);
      original_bindings.object = (_Object *)iVar12.super__iterator._cell;
      bVar2 = r_code::list<core::P<r_exec::_Fact>_>::_iterator::operator!=
                        ((_iterator *)local_90,(_iterator *)&original_bindings);
      if (!bVar2) break;
      pHVar7 = core::P<r_exec::HLPBindingMap>::operator->
                         ((P<r_exec::HLPBindingMap> *)&bound_pattern);
      source = core::P::operator_cast_to_HLPBindingMap_((P *)&(this->super_HLPOverlay).bindings);
      HLPBindingMap::load(pHVar7,source);
      sVar8 = std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::size
                        (&this->inputs);
      if (sVar8 == 0) {
        pHVar7 = core::P<r_exec::HLPBindingMap>::operator->
                           ((P<r_exec::HLPBindingMap> *)&bound_pattern);
        BindingMap::reset_fwd_timings(&pHVar7->super_BindingMap,(_Fact *)prediction);
      }
      pHVar7 = core::P<r_exec::HLPBindingMap>::operator->
                         ((P<r_exec::HLPBindingMap> *)&bound_pattern);
      pPVar9 = (P *)r_code::list<core::P<r_exec::_Fact>_>::const_iterator::operator*
                              ((const_iterator *)local_90);
      p_Var6 = core::P::operator_cast_to__Fact_(pPVar9);
      bVar2 = BindingMap::match_fwd_strict(&pHVar7->super_BindingMap,(_Fact *)prediction,p_Var6);
      if (bVar2) {
        pPVar9 = (P *)r_code::list<core::P<r_exec::_Fact>_>::const_iterator::operator*
                                ((const_iterator *)local_90);
        p._list = (list<core::P<r_exec::_Fact>_> *)core::P::operator_cast_to__Fact_(pPVar9);
        break;
      }
      r_code::list<core::P<r_exec::_Fact>_>::const_iterator::operator++((const_iterator *)local_90);
    }
    if (p._list == (list<core::P<r_exec::_Fact>_> *)0x0) {
      *offspring = (CSTOverlay *)0x0;
      this_local._7_1_ = 0;
    }
    else {
      uVar10 = r_code::list<core::P<r_exec::_Fact>_>::size(&(this->super_HLPOverlay).patterns);
      if (uVar10 == 1) {
        if ((this->super_HLPOverlay).super_Overlay.code == (Atom *)0x0) {
          Overlay::load_code((Overlay *)this);
          core::P<r_exec::HLPBindingMap>::P(&local_b8,&(this->super_HLPOverlay).bindings);
          core::P<r_exec::HLPBindingMap>::operator=
                    (&(this->super_HLPOverlay).bindings,(P<r_exec::HLPBindingMap> *)&bound_pattern);
          bVar2 = HLPOverlay::evaluate_fwd_guards(&this->super_HLPOverlay);
          if (bVar2) {
            pHVar7 = core::P::operator_cast_to_HLPBindingMap_((P *)&bound_pattern);
            p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
            update(this,pHVar7,p_Var6,(_Fact *)p._list);
            inject_production(this);
            Overlay::invalidate((Overlay *)this);
            *offspring = (CSTOverlay *)0x0;
            p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
            HLPOverlay::store_evidence
                      (&this->super_HLPOverlay,p_Var6,this_00 != (Pred *)0x0,
                       (bool)(bm.object._7_1_ & 1));
            this_local._7_1_ = 1;
          }
          else {
            pAVar1 = (this->super_HLPOverlay).super_Overlay.code;
            if (pAVar1 != (Atom *)0x0) {
              this_01 = pAVar1 + *(long *)(pAVar1 + -8) * 4;
              while (pAVar1 != this_01) {
                this_01 = this_01 + -4;
                r_code::Atom::~Atom(this_01);
              }
              operator_delete__(pAVar1 + -8);
            }
            (this->super_HLPOverlay).super_Overlay.code = (Atom *)0x0;
            *offspring = (CSTOverlay *)0x0;
            this_local._7_1_ = 0;
          }
          core::P<r_exec::HLPBindingMap>::~P(&local_b8);
        }
        else {
          pHVar7 = core::P::operator_cast_to_HLPBindingMap_((P *)&bound_pattern);
          p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
          update(this,pHVar7,p_Var6,(_Fact *)p._list);
          inject_production(this);
          Overlay::invalidate((Overlay *)this);
          *offspring = (CSTOverlay *)0x0;
          p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
          HLPOverlay::store_evidence
                    (&this->super_HLPOverlay,p_Var6,this_00 != (Pred *)0x0,
                     (bool)(bm.object._7_1_ & 1));
          this_local._7_1_ = 1;
        }
      }
      else {
        pHVar7 = core::P::operator_cast_to_HLPBindingMap_((P *)&bound_pattern);
        p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
        pCVar11 = get_offspring(this,pHVar7,p_Var6,(_Fact *)p._list);
        *offspring = pCVar11;
        p_Var6 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
        HLPOverlay::store_evidence
                  (&this->super_HLPOverlay,p_Var6,this_00 != (Pred *)0x0,(bool)(bm.object._7_1_ & 1)
                  );
        this_local._7_1_ = 1;
      }
    }
    core::P<r_exec::HLPBindingMap>::~P((P<r_exec::HLPBindingMap> *)&bound_pattern);
  }
  else {
    *offspring = (CSTOverlay *)0x0;
    this_local._7_1_ = 0;
  }
LAB_0021d4af:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CSTOverlay::reduce(View *input, CSTOverlay *&offspring)
{
    if (input->object->is_invalidated()) {
        offspring = nullptr;
        return false;
    }

    for (P<_Fact> currentInput : inputs) { // discard inputs that already matched.
        if (((_Fact *)input->object) == currentInput) {
            offspring = nullptr;
            return false;
        }
    }

    // uint64_t now=Now();
    // if(match_deadline==0)
    // std::cout<<Time::ToString_seconds(Now()-st)<<" "<<std::hex<<this<<std::dec<<" (0) "<<input->object->get_oid()<<std::endl;
    // else
    // std::cout<<Time::ToString_seconds(Now()-st)<<" "<<std::hex<<this<<std::dec<<" ("<<Time::ToString_seconds(match_deadline-st)<<") "<<input->object->get_oid()<<std::endl;
    _Fact *input_object;
    Pred *prediction = ((_Fact *)input->object)->get_pred();
    bool simulation;

    if (prediction) {
        input_object = prediction->get_target(); // input_object is f1 as in f0->pred->f1->object.
        simulation = prediction->is_simulation();
    } else {
        input_object = (_Fact *)input->object;
        simulation = false;
    }

    P<HLPBindingMap> bm = new HLPBindingMap();
    _Fact *bound_pattern = nullptr;
    r_code::list<P<_Fact> >::const_iterator p;

    for (p = patterns.begin(); p != patterns.end(); ++p) {
        bm->load(bindings);

        if (inputs.size() == 0) {
            bm->reset_fwd_timings(input_object);
        }

        if (bm->match_fwd_strict(input_object, *p)) {
            bound_pattern = *p;
            break;
        }
    }

    if (bound_pattern) {
        //if(match_deadline==0){
        // std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" "<<std::hex<<this<<std::dec<<" (0) ";
        //}else{
        // std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" "<<std::hex<<this<<std::dec<<" ("<<Time::ToString_seconds(match_deadline-Utils::GetTimeReference())<<") ";
        //}
        if (patterns.size() == 1) { // last match.
            if (!code) {
                load_code();
                P<HLPBindingMap> original_bindings = bindings;
                bindings = bm;

                if (evaluate_fwd_guards()) { // may update bindings; full match.
                    //std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" full match\n";
                    update(bm, (_Fact *)input->object, bound_pattern);
                    inject_production();
                    invalidate();
                    offspring = nullptr;
                    store_evidence(input->object, prediction, simulation);
                    return true;
                } else {
                    //std::cout<<" guards failed\n";
                    delete[] code;
                    code = nullptr;
                    offspring = nullptr;
                    return false;
                }
            } else { // guards already evaluated, full match.
                //std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" full match\n";
                update(bm, (_Fact *)input->object, bound_pattern);
                inject_production();
                invalidate();
                offspring = nullptr;
                store_evidence(input->object, prediction, simulation);
                return true;
            }
        } else {
            //std::cout<<" match\n";
            offspring = get_offspring(bm, (_Fact *)input->object, bound_pattern);
            store_evidence(input->object, prediction, simulation);
            return true;
        }
    } else {
        //std::cout<<" no match\n";
        offspring = nullptr;
        return false;
    }
}